

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_refine_free(lysf_ctx *ctx,lysp_refine *ref)

{
  lysp_ext_instance *local_78;
  ulong local_68;
  lysp_ext_instance *local_58;
  ulong local_48;
  lysp_ext_instance *local_38;
  uint64_t c___3;
  uint64_t c___2;
  uint64_t c___1;
  uint64_t c__;
  lysp_refine *ref_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,ref->nodeid);
  lydict_remove(ctx->ctx,ref->dsc);
  lydict_remove(ctx->ctx,ref->ref);
  c___1 = 0;
  while( true ) {
    if (ref->iffeatures == (lysp_qname *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(ulong *)&ref->iffeatures[-1].flags;
    }
    if (local_48 <= c___1) break;
    lysp_qname_free(ctx->ctx,ref->iffeatures + c___1);
    c___1 = c___1 + 1;
  }
  if (ref->iffeatures != (lysp_qname *)0x0) {
    free(&ref->iffeatures[-1].flags);
  }
  c___2 = 0;
  while( true ) {
    if (ref->musts == (lysp_restr *)0x0) {
      local_58 = (lysp_ext_instance *)0x0;
    }
    else {
      local_58 = ref->musts[-1].exts;
    }
    if (local_58 <= c___2) break;
    lysp_restr_free(ctx,ref->musts + c___2);
    c___2 = c___2 + 1;
  }
  if (ref->musts != (lysp_restr *)0x0) {
    free(&ref->musts[-1].exts);
  }
  lydict_remove(ctx->ctx,ref->presence);
  c___3 = 0;
  while( true ) {
    if (ref->dflts == (lysp_qname *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = *(ulong *)&ref->dflts[-1].flags;
    }
    if (local_68 <= c___3) break;
    lysp_qname_free(ctx->ctx,ref->dflts + c___3);
    c___3 = c___3 + 1;
  }
  if (ref->dflts != (lysp_qname *)0x0) {
    free(&ref->dflts[-1].flags);
  }
  local_38 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (ref->exts == (lysp_ext_instance *)0x0) {
      local_78 = (lysp_ext_instance *)0x0;
    }
    else {
      local_78 = ref->exts[-1].exts;
    }
    if (local_78 <= local_38) break;
    lysp_ext_instance_free(ctx,ref->exts + (long)local_38);
    local_38 = (lysp_ext_instance *)((long)&local_38->name + 1);
  }
  if (ref->exts != (lysp_ext_instance *)0x0) {
    free(&ref->exts[-1].exts);
  }
  return;
}

Assistant:

static void
lysp_refine_free(struct lysf_ctx *ctx, struct lysp_refine *ref)
{
    lydict_remove(ctx->ctx, ref->nodeid);
    lydict_remove(ctx->ctx, ref->dsc);
    lydict_remove(ctx->ctx, ref->ref);
    FREE_ARRAY(ctx->ctx, ref->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, ref->musts, lysp_restr_free);
    lydict_remove(ctx->ctx, ref->presence);
    FREE_ARRAY(ctx->ctx, ref->dflts, lysp_qname_free);
    FREE_ARRAY(ctx, ref->exts, lysp_ext_instance_free);
}